

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_get_chunk_table_offset
          (exr_const_context_t_conflict ctxt,int part_index,uint64_t *chunk_offset_out)

{
  undefined8 uVar1;
  exr_const_context_t_conflict in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_const_priv_part_t part;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_RDX);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_RDX);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else if (in_RDX == (exr_const_context_t_conflict)0x0) {
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
    }
    else {
      uVar1 = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8) + 0xf8);
      in_RDX->mode = (char)uVar1;
      in_RDX->version = (char)((ulong)uVar1 >> 8);
      in_RDX->max_name_length = (char)((ulong)uVar1 >> 0x10);
      in_RDX->is_singlepart_tiled = (char)((ulong)uVar1 >> 0x18);
      in_RDX->has_nonimage_data = (char)((ulong)uVar1 >> 0x20);
      in_RDX->is_multipart = (char)((ulong)uVar1 >> 0x28);
      in_RDX->strict_header = (char)((ulong)uVar1 >> 0x30);
      in_RDX->silent_header = (char)((ulong)uVar1 >> 0x38);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_chunk_table_offset (
    exr_const_context_t ctxt, int part_index, uint64_t* chunk_offset_out)
{
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    if (!chunk_offset_out)
        return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    *chunk_offset_out = part->chunk_table_offset;
    return EXR_ERR_SUCCESS;
}